

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O2

int myutils::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                   timeval *__timeout)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval tv;
  
  if (__readfds != (fd_set *)0x0) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      __readfds->fds_bits[lVar2] = 0;
    }
  }
  if (__writefds != (fd_set *)0x0) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      __writefds->fds_bits[lVar2] = 0;
    }
  }
  if (__readfds != (fd_set *)0x0) {
    __readfds->fds_bits[__nfds / 0x40] =
         __readfds->fds_bits[__nfds / 0x40] | 1L << ((byte)__nfds & 0x3f);
  }
  if (__writefds != (fd_set *)0x0) {
    __writefds->fds_bits[__nfds / 0x40] =
         __writefds->fds_bits[__nfds / 0x40] | 1L << ((byte)__nfds & 0x3f);
  }
  tv.tv_sec = 0;
  tv.tv_usec = 500000;
  iVar1 = ::select(__nfds + 1,__readfds,__writefds,(fd_set *)0x0,(timeval *)&tv);
  return iVar1;
}

Assistant:

int select(SOCKET socket, fd_set* rset, fd_set* wset)
    {
        if (rset) FD_ZERO(rset);
        if (wset) FD_ZERO(wset);

        if (rset) FD_SET(socket, rset);
        if (wset) FD_SET(socket, wset);

        struct timeval tv;
        tv.tv_sec = 0;
        tv.tv_usec = 500 * 1000;

        int high_sock = (int)socket;
        return ::select(high_sock + 1, rset, wset, NULL, &tv);
    }